

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set.h
# Opt level: O0

const_iterator __thiscall
frozen::
unordered_set<frozen::basic_string<char>,_3UL,_frozen::elsa<frozen::basic_string<char>_>,_std::equal_to<frozen::basic_string<char>_>_>
::find<char[2]>(unordered_set<frozen::basic_string<char>,_3UL,_frozen::elsa<frozen::basic_string<char>_>,_std::equal_to<frozen::basic_string<char>_>_>
                *this,char (*key) [2])

{
  hasher *hasher;
  const_iterator pvVar1;
  unordered_set<frozen::basic_string<char>,_3UL,_frozen::elsa<frozen::basic_string<char>_>,_std::equal_to<frozen::basic_string<char>_>_>
  *puVar2;
  unordered_set<frozen::basic_string<char>,_3UL,_frozen::elsa<frozen::basic_string<char>_>,_std::equal_to<frozen::basic_string<char>_>_>
  *puVar3;
  key_equal *this_00;
  bool local_41;
  basic_string<char> local_40;
  unordered_set<frozen::basic_string<char>,_3UL,_frozen::elsa<frozen::basic_string<char>_>,_std::equal_to<frozen::basic_string<char>_>_>
  *local_30;
  const_iterator it;
  size_t pos;
  char (*key_local) [2];
  unordered_set<frozen::basic_string<char>,_3UL,_frozen::elsa<frozen::basic_string<char>_>,_std::equal_to<frozen::basic_string<char>_>_>
  *this_local;
  
  pos = (size_t)key;
  key_local = (char (*) [2])this;
  hasher = hash_function(this);
  it = (const_iterator)
       bits::pmh_tables<8ul,frozen::elsa<frozen::basic_string<char>>>::
       lookup<char[2],frozen::elsa<frozen::basic_string<char>>>
                 ((pmh_tables<8ul,frozen::elsa<frozen::basic_string<char>>> *)&this->tables_,key,
                  hasher);
  pvVar1 = bits::carray<frozen::basic_string<char>,_3UL>::begin(&this->keys_);
  puVar2 = (unordered_set<frozen::basic_string<char>,_3UL,_frozen::elsa<frozen::basic_string<char>_>,_std::equal_to<frozen::basic_string<char>_>_>
            *)(pvVar1 + (long)it);
  local_30 = puVar2;
  puVar3 = (unordered_set<frozen::basic_string<char>,_3UL,_frozen::elsa<frozen::basic_string<char>_>,_std::equal_to<frozen::basic_string<char>_>_>
            *)bits::carray<frozen::basic_string<char>,_3UL>::end(&this->keys_);
  local_41 = false;
  if (puVar2 != puVar3) {
    this_00 = key_eq(this);
    puVar2 = local_30;
    basic_string<char>::basic_string<2ul>(&local_40,(chr_t (*) [2])pos);
    local_41 = std::equal_to<frozen::basic_string<char>_>::operator()
                         (this_00,(basic_string<char> *)puVar2,&local_40);
  }
  if (local_41 == false) {
    this_local = (unordered_set<frozen::basic_string<char>,_3UL,_frozen::elsa<frozen::basic_string<char>_>,_std::equal_to<frozen::basic_string<char>_>_>
                  *)bits::carray<frozen::basic_string<char>,_3UL>::end(&this->keys_);
  }
  else {
    this_local = local_30;
  }
  return (const_iterator)this_local;
}

Assistant:

constexpr const_iterator find(KeyType const &key) const {
    auto const pos = tables_.lookup(key, hash_function());
    auto it = keys_.begin() + pos;
    if (it != keys_.end() && key_eq()(*it, key))
      return it;
    else
      return keys_.end();
  }